

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

uint64_t sum_quotients<unsigned_int,libdivide::divider<unsigned_int,(libdivide::Branching)0>>
                   (random_numerators<unsigned_int> *vals,
                   divider<unsigned_int,_(libdivide::Branching)0> *div)

{
  byte bVar1;
  uint uVar2;
  random_numerators<unsigned_int> *this;
  random_numerators<unsigned_int> *prVar3;
  uint *in_RSI;
  random_numerators<unsigned_int> *in_RDI;
  const_iterator iter;
  UIntT sum;
  uint32_t t;
  uint32_t q;
  uint64_t rl;
  uint64_t yl;
  uint64_t xl;
  random_numerators<unsigned_int> *prVar4;
  uint local_84;
  uint local_24;
  
  local_84 = 0;
  this = (random_numerators<unsigned_int> *)random_numerators<unsigned_int>::begin(in_RDI);
  while( true ) {
    prVar4 = this;
    prVar3 = (random_numerators<unsigned_int> *)random_numerators<unsigned_int>::end(this);
    if (this == prVar3) break;
    local_24 = *(uint *)&prVar4->_pData;
    bVar1 = (byte)in_RSI[1];
    if (*in_RSI == 0) {
      local_24 = local_24 >> (bVar1 & 0x1f);
    }
    else {
      uVar2 = (uint)((ulong)local_24 * (ulong)*in_RSI >> 0x20);
      if ((bVar1 & 0x40) == 0) {
        local_24 = uVar2 >> (bVar1 & 0x1f);
      }
      else {
        local_24 = (local_24 - uVar2 >> 1) + uVar2 >> (bVar1 & 0x1f);
      }
    }
    local_84 = local_24 + local_84;
    this = (random_numerators<unsigned_int> *)((long)&prVar4->_pData + 4);
  }
  return (ulong)local_84;
}

Assistant:

NOINLINE uint64_t sum_quotients(const random_numerators<IntT> &vals, const Divisor &div) {
    // Need to use unsigned to avoid signed integer overlow.
    typedef typename std::make_unsigned<IntT>::type UIntT;
    UIntT sum = 0;
    for (auto iter = vals.begin(); iter != vals.end(); ++iter) {
        sum += (UIntT)(*iter / div);
    }
    return (uint64_t)sum;
}